

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_saveg.cpp
# Opt level: O3

void P_SerializePlayers(FArchive *arc,bool skipload)

{
  char *__s2;
  undefined8 *puVar1;
  int iVar2;
  char **ppcVar3;
  char **ppcVar4;
  undefined8 *puVar5;
  char **str;
  long *plVar6;
  FPlayerStart *mthing;
  ulong *puVar7;
  undefined7 in_register_00000031;
  bool bVar8;
  ulong uVar9;
  int i;
  long lVar10;
  player_t *ppVar11;
  long lVar12;
  ulong uVar13;
  undefined1 *puVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  BYTE numPlayers;
  char *name;
  BYTE local_30a;
  byte local_309;
  char **local_308;
  undefined4 local_2fc;
  ulong local_2f8;
  ulong *local_2f0;
  player_t *local_2e8;
  undefined4 local_2dc;
  char **local_2d8;
  player_t local_2d0;
  
  local_2fc = (undefined4)CONCAT71(in_register_00000031,skipload);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = playeringame;
  auVar15 = psadbw((undefined1  [16])0x0,auVar15);
  local_2dc = auVar15._0_4_;
  local_30a = auVar15[0];
  if (arc->m_Storing == true) {
    FArchive::operator<<(arc,&local_30a);
    lVar10 = 0;
    do {
      if (playeringame[lVar10] == true) {
        puVar1 = (undefined8 *)
                 ((ulong)(((&DAT_00a602d8)[lVar10 * 0xa8] - 1 & 0x1cf) * 0x18) +
                 (&DAT_00a602c8)[lVar10 * 0x54]);
        do {
          puVar5 = puVar1;
          puVar1 = (undefined8 *)*puVar5;
        } while (*(int *)(puVar5 + 1) != 0x1cf);
        FArchive::WriteString(arc,*(char **)(puVar5[2] + 0x28));
        player_t::Serialize((player_t *)(&players + lVar10 * 0x54),arc);
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 != 8);
    return;
  }
  FArchive::operator<<(arc,&local_309);
  uVar9 = (ulong)local_309;
  if (uVar9 == 1) {
    local_2d8 = (char **)0x0;
    FArchive::operator<<(arc,(char **)&local_2d8);
    ppVar11 = (player_t *)&players;
    lVar10 = 0;
    bVar8 = false;
    do {
      if (playeringame[lVar10] == true) {
        if (bVar8) {
          bVar8 = true;
          if (ppVar11->mo != (APlayerPawn *)0x0) {
            (*(ppVar11->mo->super_AActor).super_DThinker.super_DObject._vptr_DObject[4])();
            ppVar11->mo = (APlayerPawn *)0x0;
          }
        }
        else {
          player_t::player_t(&local_2d0);
          player_t::Serialize(&local_2d0,arc);
          if ((char)local_2fc == '\0') {
            CopyPlayer(ppVar11,&local_2d0,(char *)local_2d8);
          }
          player_t::~player_t(&local_2d0);
          bVar8 = true;
        }
      }
      lVar10 = lVar10 + 1;
      ppVar11 = ppVar11 + 1;
    } while (lVar10 != 8);
    ppcVar3 = local_2d8;
    if (local_2d8 == (char **)0x0) goto LAB_0055c772;
  }
  else {
    ppcVar3 = (char **)operator_new__((ulong)((uint)local_309 * 8));
    local_2f0 = (ulong *)operator_new__(uVar9 * 0x2a0 | 8);
    *local_2f0 = uVar9;
    ppVar11 = (player_t *)(local_2f0 + 1);
    local_2f8 = uVar9;
    local_2e8 = ppVar11;
    if (uVar9 == 0) {
      ppcVar4 = (char **)operator_new__(0);
    }
    else {
      lVar10 = uVar9 * -0x2a0;
      lVar12 = 0;
      local_308 = ppcVar3;
      do {
        player_t::player_t(ppVar11);
        uVar9 = local_2f8;
        lVar12 = lVar12 + -0x2a0;
        ppVar11 = ppVar11 + 1;
      } while (lVar10 - lVar12 != 0);
      ppcVar4 = (char **)operator_new__(local_2f8);
      uVar13 = 0;
      str = local_308;
      ppVar11 = local_2e8;
      do {
        *str = (char *)0x0;
        FArchive::operator<<(arc,str);
        player_t::Serialize(ppVar11,arc);
        *(undefined1 *)((long)ppcVar4 + uVar13) = 0;
        uVar13 = uVar13 + 1;
        ppVar11 = ppVar11 + 1;
        str = str + 1;
        ppcVar3 = local_308;
      } while (uVar9 != uVar13);
    }
    auVar16._8_8_ = 0;
    auVar16[0] = playeringame[0];
    auVar16[1] = playeringame[1];
    auVar16[2] = playeringame[2];
    auVar16[3] = playeringame[3];
    auVar16[4] = playeringame[4];
    auVar16[5] = playeringame[5];
    auVar16[6] = playeringame[6];
    auVar16[7] = playeringame[7];
    auVar15 = psllw(auVar16,7);
    auVar15 = auVar15 & _DAT_00769770;
    local_2d0.mo = (APlayerPawn *)
                   (~CONCAT17(-(auVar15[7] < '\0'),
                              CONCAT16(-(auVar15[6] < '\0'),
                                       CONCAT15(-(auVar15[5] < '\0'),
                                                CONCAT14(-(auVar15[4] < '\0'),
                                                         CONCAT13(-(auVar15[3] < '\0'),
                                                                  CONCAT12(-(auVar15[2] < '\0'),
                                                                           CONCAT11(-(auVar15[1] <
                                                                                     '\0'),-(auVar15
                                                  [0] < '\0')))))))) & (ulong)DAT_00769780);
    puVar7 = local_2f0;
    if ((char)local_2fc == '\0') {
      local_308 = ppcVar4;
      if ((char)uVar9 != '\0') {
        uVar9 = 0;
        do {
          uVar13 = 0;
          do {
            if (*(char *)((long)&local_2d0.mo + uVar13) == '\0') {
              puVar1 = (undefined8 *)
                       ((ulong)(((&DAT_00a602d8)[uVar13 * 0xa8] - 1 & 0x1cf) * 0x18) +
                       (&DAT_00a602c8)[uVar13 * 0x54]);
              do {
                puVar5 = puVar1;
                puVar1 = (undefined8 *)*puVar5;
              } while (*(int *)(puVar5 + 1) != 0x1cf);
              __s2 = ppcVar3[uVar9];
              iVar2 = strcasecmp(*(char **)(puVar5[2] + 0x28),__s2);
              if (iVar2 == 0) {
                Printf("Found player %d (%s) at %d\n",uVar9 & 0xffffffff,__s2,uVar13 & 0xffffffff);
                CopyPlayer((player_t *)(&players + uVar13 * 0x54),local_2e8 + uVar9,ppcVar3[uVar9]);
                *(undefined1 *)((long)&local_2d0.mo + uVar13) = 1;
                *(undefined1 *)((long)local_308 + uVar9) = 1;
                break;
              }
            }
            uVar13 = uVar13 + 1;
          } while (uVar13 != 8);
          uVar9 = uVar9 + 1;
        } while (uVar9 != local_2f8);
        uVar9 = 0;
        ppcVar4 = local_308;
        do {
          if (*(char *)((long)ppcVar4 + uVar9) == '\0') {
            ppVar11 = (player_t *)&players;
            uVar13 = 0;
LAB_0055c5ef:
            if (*(char *)((long)&local_2d0.mo + uVar13) != '\0') goto code_r0x0055c5f7;
            puVar1 = (undefined8 *)
                     ((long)&((ppVar11->userinfo).
                              super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>
                             .Nodes)->Next +
                     (ulong)(((ppVar11->userinfo).
                              super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>
                              .Size - 1 & 0x1cf) * 0x18));
            do {
              puVar5 = puVar1;
              puVar1 = (undefined8 *)*puVar5;
            } while (*(int *)(puVar5 + 1) != 0x1cf);
            Printf("Assigned player %d (%s) to %d (%s)\n",uVar9 & 0xffffffff,ppcVar3[uVar9],
                   uVar13 & 0xffffffff,*(undefined8 *)(puVar5[2] + 0x28));
            CopyPlayer(ppVar11,local_2e8 + uVar9,ppcVar3[uVar9]);
            *(undefined1 *)((long)&local_2d0.mo + uVar13) = 1;
            *(undefined1 *)((long)local_308 + uVar9) = 1;
            ppcVar4 = local_308;
          }
LAB_0055c672:
          uVar9 = uVar9 + 1;
        } while (uVar9 != local_2f8);
      }
      ppVar11 = local_2e8;
      puVar7 = local_2f0;
      plVar6 = &players;
      lVar10 = 0;
      do {
        if ((*(char *)((long)&local_2d0.mo + lVar10) == '\0') && ((long *)*plVar6 != (long *)0x0)) {
          (**(code **)(*(long *)*plVar6 + 0x20))();
          *plVar6 = 0;
        }
        uVar9 = local_2f8;
        lVar10 = lVar10 + 1;
        plVar6 = plVar6 + 0x54;
      } while (lVar10 != 8);
      ppcVar4 = local_308;
      if ((char)local_2f8 != '\0') {
        uVar13 = 0;
        do {
          if (*(char *)((long)ppcVar4 + uVar13) == '\0') {
            (*(ppVar11->mo->super_AActor).super_DThinker.super_DObject._vptr_DObject[4])();
            ppVar11->mo = (APlayerPawn *)0x0;
            ppcVar4 = local_308;
          }
          uVar13 = uVar13 + 1;
          ppVar11 = ppVar11 + 1;
        } while (uVar9 != uVar13);
      }
    }
    operator_delete__(ppcVar4);
    lVar10 = *puVar7 * 0x2a0;
    uVar9 = lVar10 + 8;
    uVar13 = *puVar7;
    while (uVar13 != 0) {
      player_t::~player_t((player_t *)((long)puVar7 + lVar10 + -0x298));
      lVar10 = lVar10 + -0x2a0;
      uVar13 = lVar10;
    }
    operator_delete__(puVar7,uVar9);
    uVar9 = local_2f8;
    if ((char)local_2f8 != '\0') {
      uVar13 = 0;
      do {
        if (ppcVar3[uVar13] != (char *)0x0) {
          operator_delete__(ppcVar3[uVar13]);
        }
        uVar13 = uVar13 + 1;
      } while (uVar9 != uVar13);
    }
  }
  operator_delete__(ppcVar3);
LAB_0055c772:
  if ((((char)local_2fc == '\0') && (local_309 < (byte)local_2dc)) && (deathmatch.Value == 0)) {
    puVar14 = &DAT_00a60298;
    mthing = playerstarts;
    lVar10 = 0;
    do {
      if ((playeringame[lVar10] == true) && (*(long *)(puVar14 + -8) == 0)) {
        *puVar14 = 3;
        P_SpawnPlayer(mthing,(int)lVar10,level.flags2 >> 6 & 2);
      }
      lVar10 = lVar10 + 1;
      mthing = mthing + 1;
      puVar14 = puVar14 + 0x2a0;
    } while (lVar10 != 8);
  }
  player_t::SendPitchLimits((player_t *)(&players + (long)consoleplayer * 0x54));
  return;
code_r0x0055c5f7:
  uVar13 = uVar13 + 1;
  ppVar11 = ppVar11 + 1;
  if (uVar13 == 8) goto LAB_0055c672;
  goto LAB_0055c5ef;
}

Assistant:

void P_SerializePlayers (FArchive &arc, bool skipload)
{
	BYTE numPlayers, numPlayersNow;
	int i;

	// Count the number of players present right now.
	for (numPlayersNow = 0, i = 0; i < MAXPLAYERS; ++i)
	{
		if (playeringame[i])
		{
			++numPlayersNow;
		}
	}

	if (arc.IsStoring())
	{
		// Record the number of players in this save.
		arc << numPlayersNow;

		// Record each player's name, followed by their data.
		for (i = 0; i < MAXPLAYERS; ++i)
		{
			if (playeringame[i])
			{
				arc.WriteString (players[i].userinfo.GetName());
				players[i].Serialize (arc);
			}
		}
	}
	else
	{
		arc << numPlayers;

		// If there is only one player in the game, they go to the
		// first player present, no matter what their name.
		if (numPlayers == 1)
		{
			ReadOnePlayer (arc, skipload);
		}
		else
		{
			ReadMultiplePlayers (arc, numPlayers, numPlayersNow, skipload);
		}
		if (!skipload && numPlayersNow > numPlayers)
		{
			SpawnExtraPlayers ();
		}
		// Redo pitch limits, since the spawned player has them at 0.
		players[consoleplayer].SendPitchLimits();
	}
}